

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usage_example.cxx
# Opt level: O2

void test_basic_usage<Base>(void)

{
  TPtr TVar1;
  bool bVar2;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  double __x_05;
  double __x_06;
  double __x_07;
  TPtr ptr2;
  TPtr pt3;
  Result local_a0;
  Base local_90;
  TPtr ptr;
  ResultBuilder _DOCTEST_RB;
  long local_40;
  undefined4 local_34;
  
  ptr.ptr = (pointer)operator_new(8);
  instance_counted<Base>::numInstances = instance_counted<Base>::numInstances + 1;
  ((ptr.ptr)->super_reference_count<Base>).count = 1;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x23,"T::numInstances == 1","");
    ptr2.ptr = (pointer)&instance_counted<Base>::numInstances;
    pt3.ptr._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&ptr2);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x24,"ptr.use_count() == 1","");
    if (ptr.ptr == (pointer)0x0) {
      pt3.ptr = (pointer)0x0;
    }
    else {
      pt3.ptr = (pointer)((ptr.ptr)->super_reference_count<Base>).count;
    }
    local_90.super_reference_count<Base>.count._0_4_ = 1;
    ptr2.ptr = (pointer)&pt3;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&ptr2);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_00);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  ptr2 = ptr;
  if (ptr.ptr != (pointer)0x0) {
    ((ptr.ptr)->super_reference_count<Base>).count =
         ((ptr.ptr)->super_reference_count<Base>).count + 1;
  }
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x27,"T::numInstances == 1","");
    pt3.ptr = (pointer)&instance_counted<Base>::numInstances;
    local_90.super_reference_count<Base>.count._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&pt3);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_01);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x28,"ptr.use_count() == 2","");
    if (ptr.ptr == (pointer)0x0) {
      local_90.super_reference_count<Base>.count = (reference_count<Base>)0;
    }
    else {
      local_90 = (Base)((ptr.ptr)->super_reference_count<Base>).count;
    }
    local_40 = CONCAT44(local_40._4_4_,2);
    pt3.ptr = &local_90;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&pt3);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_02);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
    TVar1 = ptr2;
  } while (bVar2);
  ptr2.ptr = (pointer)0x0;
  pt3 = TVar1;
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2a,"T::numInstances == 1","");
    local_90.super_reference_count<Base>.count =
         (reference_count<Base>)&instance_counted<Base>::numInstances;
    local_40 = CONCAT44(local_40._4_4_,1);
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&local_90);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_03);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2b,"ptr.use_count() == 2","");
    if (ptr.ptr == (pointer)0x0) {
      local_40 = 0;
    }
    else {
      local_40 = ((ptr.ptr)->super_reference_count<Base>).count;
    }
    local_34 = 2;
    local_90.super_reference_count<Base>.count =
         (reference_count<Base>)(reference_count<Base>)&local_40;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&local_90);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_04);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  sg14::retain_ptr<Base,_sg14::retain_traits<Base>_>::~retain_ptr(&pt3);
  sg14::retain_ptr<Base,_sg14::retain_traits<Base>_>::~retain_ptr(&ptr2);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2d,"T::numInstances == 1","");
    ptr2.ptr = (pointer)&instance_counted<Base>::numInstances;
    pt3.ptr._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&ptr2);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_05);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x2e,"ptr.use_count() == 1","");
    if (ptr.ptr == (pointer)0x0) {
      pt3.ptr = (pointer)0x0;
    }
    else {
      pt3.ptr = (pointer)((ptr.ptr)->super_reference_count<Base>).count;
    }
    ptr2.ptr = (pointer)&pt3;
    local_90.super_reference_count<Base>.count._0_4_ = 1;
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&ptr2);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_06);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  sg14::retain_ptr<Base,_sg14::retain_traits<Base>_>::~retain_ptr(&ptr);
  do {
    doctest::detail::ResultBuilder::ResultBuilder
              (&_DOCTEST_RB,DT_REQUIRE,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bruxisma[P]retain-ptr/tests/usage_example.cxx"
               ,0x30,"T::numInstances == 0","");
    ptr.ptr = (pointer)&instance_counted<Base>::numInstances;
    ptr2.ptr = (pointer)((ulong)ptr2.ptr & 0xffffffff00000000);
    doctest::detail::Expression_lhs<long_const&>::operator==
              ((Expression_lhs<long_const&> *)&local_a0,(int *)&ptr);
    doctest::detail::Result::operator=(&_DOCTEST_RB.m_result,&local_a0);
    doctest::String::~String(&local_a0.m_decomposition);
    doctest::detail::ResultBuilder::log(&_DOCTEST_RB,__x_07);
    doctest::detail::ResultBuilder::react(&_DOCTEST_RB);
    doctest::String::~String(&_DOCTEST_RB.m_result.m_decomposition);
    bVar2 = doctest::detail::always_false();
  } while (bVar2);
  return;
}

Assistant:

void test_basic_usage()
{
  using TPtr = sg14::retain_ptr<T>;
  {
    TPtr ptr{new T};
    REQUIRE(T::numInstances == 1);
    REQUIRE(ptr.use_count() == 1);
    {
      TPtr ptr2{ptr};
      REQUIRE(T::numInstances == 1);
      REQUIRE(ptr.use_count() == 2);
      TPtr pt3{std::move(ptr2)};
      REQUIRE(T::numInstances == 1);
      REQUIRE(ptr.use_count() == 2);
    }
    REQUIRE(T::numInstances == 1);
    REQUIRE(ptr.use_count() == 1);
  }
  REQUIRE(T::numInstances == 0);
}